

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions.c
# Opt level: O1

_InstInfo * inst_lookup_prefixed(_InstNode in,_PrefixState *ps)

{
  ushort uVar1;
  uint uVar2;
  bool bVar3;
  _InstInfo *p_Var4;
  uint uVar5;
  uint uVar6;
  
  uVar2 = ps->decodedPrefixes;
  uVar5 = uVar2 & 0x2060;
  bVar3 = true;
  if (uVar5 < 0x40) {
    if (uVar5 == 0) goto LAB_00104ae5;
    if (uVar5 == 0x20) {
      uVar6 = 0xffffffdf;
      uVar5 = 3;
    }
    else {
LAB_00104ab1:
      if ((~uVar2 & 0x60) == 0) {
        return (_InstInfo *)0x0;
      }
      if ((uVar2 & 0x20) == 0) {
        uVar6 = 0xffffff9f;
        bVar3 = false;
        uVar5 = 2;
        if ((uVar2 & 0x40) == 0) {
          uVar5 = 0;
          goto LAB_00104ae5;
        }
      }
      else {
        uVar6 = 0xffffffdf;
        bVar3 = false;
        uVar5 = 3;
      }
    }
  }
  else if (uVar5 == 0x40) {
    uVar6 = 0xffffffbf;
    uVar5 = 2;
  }
  else {
    if (uVar5 != 0x2000) goto LAB_00104ab1;
    ps->isOpSizeMandatory = 1;
    uVar6 = 0xffffdfff;
    uVar5 = 1;
  }
  ps->decodedPrefixes = uVar2 & uVar6;
LAB_00104ae5:
  uVar1 = InstructionsTree[uVar5 + (in & 0x1fff)];
  if (uVar1 == 0) {
    p_Var4 = (_InstInfo *)0x0;
  }
  else {
    p_Var4 = (_InstInfo *)((long)&InstInfosEx[0].BASE.sharedIndex + (ulong)((uVar1 & 0x1fff) * 0xc))
    ;
    if ((uVar1 & 0xe000) == 0x2000) {
      p_Var4 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar1 & 0x1fff) * 4));
    }
  }
  if ((bVar3) ||
     ((p_Var4 != (_InstInfo *)0x0 &&
      ((*(byte *)((long)FlagsTable +
                 (ulong)InstSharedInfoTable[p_Var4->sharedIndex].flagsIndex * 4 + 1) & 0x20) != 0)))
     ) {
    if (p_Var4 != (_InstInfo *)0x0) {
      return p_Var4;
    }
    uVar1 = InstructionsTree[in & 0x1fff];
    if (uVar1 != 0) {
      p_Var4 = (_InstInfo *)
               ((long)&InstInfosEx[0].BASE.sharedIndex + (ulong)((uVar1 & 0x1fff) * 0xc));
      if ((uVar1 & 0xe000) == 0x2000) {
        p_Var4 = (_InstInfo *)((long)&InstInfos[0].sharedIndex + (ulong)((uVar1 & 0x1fff) * 4));
      }
      return p_Var4;
    }
  }
  return (_InstInfo *)0x0;
}

Assistant:

static _InstInfo* inst_lookup_prefixed(_InstNode in, _PrefixState* ps)
{
	int checkOpSize = FALSE;
	int index = 0;
	_InstInfo* ii = NULL;

	/* Check prefixes of current decoded instruction (None, 0x66, 0xf3, 0xf2). */
	switch (ps->decodedPrefixes & (INST_PRE_OP_SIZE | INST_PRE_REPS))
	{
		case 0:
			/* Non-prefixed, index = 0. */
			index = 0;
		break;
		case INST_PRE_OP_SIZE:
			/* 0x66, index = 1. */
			index = 1;
			/* Mark that we used it as a mandatory prefix. */
			ps->isOpSizeMandatory = TRUE;
			ps->decodedPrefixes &= ~INST_PRE_OP_SIZE;
		break;
		case INST_PRE_REP:
			/* 0xf3, index = 2. */
			index = 2;
			ps->decodedPrefixes &= ~INST_PRE_REP;
		break;
		case INST_PRE_REPNZ:
			/* 0xf2, index = 3. */
			index = 3;
			ps->decodedPrefixes &= ~INST_PRE_REPNZ;
		break;
		default:
			/*
			 * Now we got a problem, since there are a few mandatory prefixes at once.
			 * There is only one case when it's ok, when the operand size prefix is for real (not mandatory).
			 * Otherwise we will have to return NULL, since the instruction is illegal.
			 * Therefore we will start with REPNZ and REP prefixes,
			 * try to get the instruction and only then check for the operand size prefix.
			 */

			 /* If both REPNZ and REP are together, it's illegal for sure. */
			if ((ps->decodedPrefixes & INST_PRE_REPS) == INST_PRE_REPS) return NULL;

			/* Now we know it's either REPNZ+OPSIZE or REP+OPSIZE, so examine the instruction. */
			if (ps->decodedPrefixes & INST_PRE_REPNZ) {
				index = 3;
				ps->decodedPrefixes &= ~INST_PRE_REPNZ;
			}
			else if (ps->decodedPrefixes & INST_PRE_REP) {
				index = 2;
				ps->decodedPrefixes &= ~INST_PRE_REP;
			}
			/* Mark to verify the operand-size prefix of the fetched instruction below. */
			checkOpSize = TRUE;
		break;
	}

	/* Fetch the inst-info from the index. */
	ii = inst_get_info(in, index);

	if (checkOpSize) {
		/* If the instruction doesn't support operand size prefix, then it's illegal. */
		if ((ii == NULL) || (~INST_INFO_FLAGS(ii) & INST_PRE_OP_SIZE)) return NULL;
	}

	/* If there was a prefix, but the instruction wasn't found. Try to fall back to use the normal instruction. */
	if (ii == NULL) ii = inst_get_info(in, 0);
	return ii;
}